

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::DerefInc(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *self,SQObjectPtr *key,
              SQObjectPtr *incr,bool postfix,SQInteger selfidx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  SQObjectPtr tkey;
  SQObjectPtr tself;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  local_60.super_SQObject._type = OT_NULL;
  local_60.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_40.super_SQObject._type = (self->super_SQObject)._type;
  local_40.super_SQObject._unVal = (SQObjectValue)(self->super_SQObject)._unVal.pTable;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_50.super_SQObject._type = (key->super_SQObject)._type;
  local_50.super_SQObject._unVal = (SQObjectValue)(key->super_SQObject)._unVal.pTable;
  if ((local_50.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_50.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  bVar4 = Get(this,&local_40,&local_50,&local_60,0,selfidx);
  if (bVar4) {
    bVar4 = ARITH_OP(this,op,target,&local_60,incr);
    if (bVar4) {
      bVar4 = Set(this,&local_40,&local_50,target,selfidx);
      if (bVar4 && postfix) {
        SVar2 = (target->super_SQObject)._type;
        pSVar3 = (target->super_SQObject)._unVal.pTable;
        (target->super_SQObject)._unVal.pTable = (SQTable *)local_60.super_SQObject._unVal;
        (target->super_SQObject)._type = local_60.super_SQObject._type;
        if ((local_60.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_60.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        bVar4 = true;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
      }
      goto LAB_001212aa;
    }
  }
  bVar4 = false;
LAB_001212aa:
  SQObjectPtr::~SQObjectPtr(&local_50);
  SQObjectPtr::~SQObjectPtr(&local_40);
  SQObjectPtr::~SQObjectPtr(&local_60);
  return bVar4;
}

Assistant:

bool SQVM::DerefInc(SQInteger op,SQObjectPtr &target, SQObjectPtr &self, SQObjectPtr &key, SQObjectPtr &incr, bool postfix,SQInteger selfidx)
{
    SQObjectPtr tmp, tself = self, tkey = key;
    if (!Get(tself, tkey, tmp, 0, selfidx)) { return false; }
    _RET_ON_FAIL(ARITH_OP( op , target, tmp, incr))
    if (!Set(tself, tkey, target,selfidx)) { return false; }
    if (postfix) target = tmp;
    return true;
}